

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

int template_put(void *closure,char *name,int escape,FILE *file)

{
  long lVar1;
  int iVar2;
  size_t __n;
  uint *puVar3;
  long in_FS_OFFSET;
  pfx_record *pfx_record;
  size_t namelen;
  exporter_state *state;
  FILE *file_local;
  int escape_local;
  char *name_local;
  void *closure_local;
  char local_48 [8];
  char prefix_str [46];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  if (((*closure & 1) == 0) || (__n == 0)) {
    closure_local._4_4_ = -1;
  }
  else {
    puVar3 = (uint *)tommy_array_get(*(tommy_array **)((long)closure + 8),
                                     *(tommy_count_t *)((long)closure + 4));
    iVar2 = strncmp("prefix",name,__n);
    if (iVar2 == 0) {
      lrtr_ip_addr_to_str(puVar3 + 1,local_48,0x2e);
      fputs(local_48,(FILE *)file);
    }
    else {
      iVar2 = strncmp("length",name,__n);
      if (iVar2 == 0) {
        fprintf((FILE *)file,"%d",(ulong)(byte)puVar3[6]);
      }
      else {
        iVar2 = strncmp("maxlen",name,__n);
        if (iVar2 == 0) {
          fprintf((FILE *)file,"%d",(ulong)*(byte *)((long)puVar3 + 0x19));
        }
        else {
          iVar2 = strncmp("origin",name,__n);
          if (iVar2 == 0) {
            fprintf((FILE *)file,"%d",(ulong)*puVar3);
          }
        }
      }
    }
    closure_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return closure_local._4_4_;
}

Assistant:

static int template_put(void *closure, const char *name, __attribute__((unused)) int escape, FILE *file)
{
	struct exporter_state *state = closure;

	size_t namelen = strlen(name);

	if (!state->roa_section || namelen == 0)
		return MUSTACH_ERROR_SYSTEM;

	struct pfx_record *pfx_record = tommy_array_get(state->roas, state->current_roa);

	if (strncmp("prefix", name, namelen) == 0) {
		char prefix_str[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&pfx_record->prefix, prefix_str, sizeof(prefix_str));
		fputs(prefix_str, file);

	} else if (strncmp("length", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->min_len);

	} else if (strncmp("maxlen", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->max_len);

	} else if (strncmp("origin", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->asn);
	}

	return MUSTACH_OK;
}